

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlSAXParseFile(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 uVar2;
  PyObject *pPVar3;
  PyObject *pyobj_SAX;
  char *URI;
  int recover;
  long *local_20;
  undefined8 local_18;
  undefined1 local_c [4];
  
  local_20 = (long *)0x0;
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Osi:xmlSAXParseFile",&local_20,&local_18,local_c);
  if (iVar1 != 0) {
    if (local_20 != (long *)&_Py_NoneStruct) {
      *local_20 = *local_20 + 1;
      uVar2 = xmlNewSAXParserCtxt(&pythonSaxHandler);
      xmlCtxtReadFile(uVar2,local_18,0,0);
      xmlFreeParserCtxt(uVar2);
    }
    pPVar3 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar3;
}

Assistant:

PyObject *
libxml_xmlSAXParseFile(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    int recover;
    const char *URI;
    PyObject *pyobj_SAX = NULL;
    xmlSAXHandlerPtr SAX = NULL;
    xmlParserCtxtPtr ctxt;

    if (!PyArg_ParseTuple(args, (char *) "Osi:xmlSAXParseFile", &pyobj_SAX,
                          &URI, &recover))
        return (NULL);

    if (pyobj_SAX == Py_None) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    SAX = &pythonSaxHandler;
    Py_INCREF(pyobj_SAX);
    /* The reference is released in pythonEndDocument() */
    ctxt = xmlNewSAXParserCtxt(SAX, pyobj_SAX);
    xmlCtxtReadFile(ctxt, URI, NULL, 0);
    xmlFreeParserCtxt(ctxt);
    Py_INCREF(Py_None);
    return (Py_None);
}